

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFullNameInternal
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_88 [8];
  string suffix;
  string base;
  string prefix;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_88);
  GetFullNameInternal(this,config,artifact,(string *)(base.field_2._M_local_buf + 8),
                      (string *)(suffix.field_2._M_local_buf + 8),(string *)local_88);
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&base.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8));
  std::operator+(__return_storage_ptr__,&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, artifact, prefix, base, suffix);
  return prefix + base + suffix;
}